

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

Status __thiscall
soplex::SoPlexBase<double>::_solveRealForRational
          (SoPlexBase<double> *this,bool fromscratch,VectorBase<double> *primal,
          VectorBase<double> *dual,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  Verbosity VVar5;
  uint uVar6;
  uint uVar7;
  SPxStatus SVar8;
  int iVar9;
  VarStatus *pVVar10;
  VectorBase<double> *vec;
  VarStatus *pVVar11;
  SPxBasisBase<double> *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  byte in_SIL;
  time_t *__timer;
  SoPlexBase<double> *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R8;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  Real RVar12;
  double extraout_XMM0_Qa;
  Verbosity old_verbosity_2;
  SPxInternalCodeException *E;
  VectorBase<double> tmpRedCost;
  VectorBase<double> tmpDual;
  VectorBase<double> tmpSlacks;
  VectorBase<double> tmpPrimal;
  bool vanished;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Real remainingTime;
  bool keepbounds;
  int oldIterations;
  Result simplificationStatus;
  SPxLPRational *rationalLP;
  Status result;
  _func_ostream_ptr_ostream_ptr *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  SPxSolverBase<double> *in_stack_fffffffffffffae8;
  SPxSolverBase<double> *in_stack_fffffffffffffaf0;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_fffffffffffffaf8;
  SoPlexBase<double> *in_stack_fffffffffffffb00;
  SPxLPBase<double> *in_stack_fffffffffffffb18;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  SPxSolverBase<double> *in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  SPxSolverBase<double> *in_stack_fffffffffffffb58;
  SPxSolverBase<double> *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  SPxSolverBase<double> *in_stack_fffffffffffffb88;
  VectorBase<double> *in_stack_fffffffffffffba8;
  SPxSolverBase<double> *in_stack_fffffffffffffbb0;
  VectorBase<double> *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  bool *in_stack_fffffffffffffc48;
  SPxSimplifier<double> *pSVar13;
  SoPlexBase<double> *in_stack_fffffffffffffc50;
  Status local_33c;
  SPxLPBase<double> local_2d8;
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  undefined1 local_90 [27];
  byte local_75;
  Verbosity local_74;
  Verbosity local_70 [6];
  double local_58;
  byte local_49;
  int local_48;
  int local_44;
  undefined8 *local_40;
  Status local_34;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_30;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_28;
  undefined8 local_20;
  undefined8 local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_34 = UNKNOWN;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  if ((local_9 == 0) && ((in_RDI->_hasBasis & 1U) != 0)) {
    _disableSimplifierAndScaler(in_RDI);
  }
  else {
    _enableSimplifierAndScaler(in_stack_fffffffffffffb00);
  }
  if ((local_9 & 1) != 0) {
    SPxSolverBase<double>::reLoad
              ((SPxSolverBase<double> *)
               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  }
  (*in_RDI->_statistics->syncTime->_vptr_Timer[3])();
  local_40 = (undefined8 *)0x0;
  if ((in_RDI->_simplifier != (SPxSimplifier<double> *)0x0) ||
     (in_RDI->_scaler != (SPxScaler<double> *)0x0)) {
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                **)in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    puVar1 = local_40;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::SPxLPBase<double>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    local_40 = puVar1;
  }
  if (((in_RDI->_simplifier != (SPxSimplifier<double> *)0x0) ||
      (in_RDI->_scaler != (SPxScaler<double> *)0x0)) || ((local_9 & 1) != 0)) {
    SLUFactorRational::clear
              ((SLUFactorRational *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  }
  (*in_RDI->_statistics->syncTime->_vptr_Timer[4])();
  local_44 = 0;
  local_48 = in_RDI->_statistics->iterations;
  if (in_RDI->_simplifier != (SPxSimplifier<double> *)0x0) {
    __timer = (time_t *)0xe;
    iVar3 = intParam(in_RDI,RATIOTESTER);
    local_49 = iVar3 == 3;
    RVar12 = SPxSolverBase<double>::getMaxTime(&in_RDI->_solver);
    SPxSolverBase<double>::time(&in_RDI->_solver,__timer);
    pSVar13 = in_RDI->_simplifier;
    uVar6 = (uint)local_49;
    local_58 = RVar12 - extraout_XMM0_Qa;
    uVar4 = Random::getSeed(&(in_RDI->_solver).random);
    local_44 = (*pSVar13->_vptr_SPxSimplifier[5])
                         (RVar12 - extraout_XMM0_Qa,pSVar13,&in_RDI->_solver,(ulong)(uVar6 & 1),
                          (ulong)uVar4);
  }
  if ((in_RDI->_scaler != (SPxScaler<double> *)0x0) && (local_44 == 0)) {
    (*in_RDI->_scaler->_vptr_SPxScaler[0xd])(in_RDI->_scaler,&in_RDI->_solver,0);
  }
  if (local_44 == 0) {
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
      local_70[2] = SPxOut::getVerbosity(&in_RDI->spxout);
      local_70[1] = 3;
      SPxOut::setVerbosity(&in_RDI->spxout,local_70 + 1);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                         in_stack_fffffffffffffad8);
      SPxOut::setVerbosity(&in_RDI->spxout,local_70 + 2);
    }
    _solveRealLPAndRecordStatistics(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
      local_70[0] = SPxOut::getVerbosity(&in_RDI->spxout);
      local_74 = INFO1;
      SPxOut::setVerbosity(&in_RDI->spxout,&local_74);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                         in_stack_fffffffffffffad8);
      SPxOut::setVerbosity(&in_RDI->spxout,local_70);
    }
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  if (local_44 == 1) {
    local_34 = INFEASIBLE;
  }
  else if (local_44 == 2) {
    local_34 = INForUNBD;
  }
  else if (local_44 == 3) {
    local_34 = UNBOUNDED;
  }
  else if ((local_44 == 4) || (local_44 == 0)) {
    if (local_44 == 4) {
      local_33c = OPTIMAL;
    }
    else {
      local_33c = SPxSolverBase<double>::status(in_stack_fffffffffffffae8);
    }
    local_34 = local_33c;
    switch(local_33c) {
    case OPTIMAL:
      if (in_RDI->_simplifier == (SPxSimplifier<double> *)0x0) {
        SPxSolverBase<double>::getPrimalSol
                  ((SPxSolverBase<double> *)
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   in_stack_fffffffffffffbc0);
        SPxSolverBase<double>::getDualSol
                  (in_stack_fffffffffffffb88,
                   (VectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        if (in_RDI->_scaler != (SPxScaler<double> *)0x0) {
          (*in_RDI->_scaler->_vptr_SPxScaler[0x22])(in_RDI->_scaler,&in_RDI->_solver,local_18);
          (*in_RDI->_scaler->_vptr_SPxScaler[0x24])(in_RDI->_scaler,&in_RDI->_solver,local_20);
        }
        SPxLPBase<double>::nRows((SPxLPBase<double> *)0x42ec3e);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
        SPxLPBase<double>::nCols((SPxLPBase<double> *)0x42ec81);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_28);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_30);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
        SPxSolverBase<double>::getBasis
                  ((SPxSolverBase<double> *)in_stack_fffffffffffffb00,
                   (VarStatus *)in_stack_fffffffffffffaf8,(VarStatus *)in_stack_fffffffffffffaf0,
                   (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(int)in_stack_fffffffffffffae8);
        in_RDI->_hasBasis = true;
      }
      else {
        local_75 = local_44 == 4;
        if (!(bool)local_75) {
          SPxLPBase<double>::nCols((SPxLPBase<double> *)0x42e318);
        }
        VectorBase<double>::VectorBase
                  ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                   (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
        if ((local_75 & 1) == 0) {
          SPxLPBase<double>::nRows((SPxLPBase<double> *)0x42e370);
        }
        VectorBase<double>::VectorBase
                  ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                   (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
        if ((local_75 & 1) == 0) {
          SPxLPBase<double>::nRows((SPxLPBase<double> *)0x42e3c8);
        }
        VectorBase<double>::VectorBase
                  ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                   (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
        if ((local_75 & 1) == 0) {
          SPxLPBase<double>::nCols((SPxLPBase<double> *)0x42e420);
        }
        VectorBase<double>::VectorBase
                  ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                   (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
        if ((local_75 & 1) == 0) {
          SPxSolverBase<double>::getPrimalSol
                    ((SPxSolverBase<double> *)
                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                     in_stack_fffffffffffffbc0);
          SPxSolverBase<double>::getSlacks(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          SPxSolverBase<double>::getDualSol
                    (in_stack_fffffffffffffb88,
                     (VectorBase<double> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          SPxSolverBase<double>::getRedCostSol(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          if (in_RDI->_scaler != (SPxScaler<double> *)0x0) {
            (*in_RDI->_scaler->_vptr_SPxScaler[0x22])(in_RDI->_scaler,&in_RDI->_solver,local_90);
            (*in_RDI->_scaler->_vptr_SPxScaler[0x23])(in_RDI->_scaler,&in_RDI->_solver,local_a8);
            (*in_RDI->_scaler->_vptr_SPxScaler[0x24])(in_RDI->_scaler,&in_RDI->_solver,local_c0);
            (*in_RDI->_scaler->_vptr_SPxScaler[0x25])(in_RDI->_scaler,&in_RDI->_solver,local_d8);
          }
          SPxLPBase<double>::nRows((SPxLPBase<double> *)0x42e625);
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                    ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
          SPxLPBase<double>::nCols((SPxLPBase<double> *)0x42e668);
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                    ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_28);
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_30);
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
          SPxSolverBase<double>::getBasis
                    ((SPxSolverBase<double> *)in_stack_fffffffffffffb00,
                     (VarStatus *)in_stack_fffffffffffffaf8,(VarStatus *)in_stack_fffffffffffffaf0,
                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(int)in_stack_fffffffffffffae8)
          ;
        }
        pSVar13 = in_RDI->_simplifier;
        pVVar10 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_28);
        vec = (VectorBase<double> *)
              DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_30);
        in_stack_fffffffffffffae0 = 1;
        (*pSVar13->_vptr_SPxSimplifier[6])(pSVar13,local_90,local_c0,local_a8,local_d8,pVVar10);
        numRowsRational((SoPlexBase<double> *)0x42e8eb);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   (int)((ulong)vec >> 0x20));
        numColsRational((SoPlexBase<double> *)0x42e927);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   (int)((ulong)vec >> 0x20));
        pSVar13 = in_RDI->_simplifier;
        pVVar10 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_28);
        pVVar11 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_30);
        uVar6 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
        uVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
        (*pSVar13->_vptr_SPxSimplifier[0xf])(pSVar13,pVVar10,pVVar11,(ulong)uVar6,(ulong)uVar7);
        in_RDI->_hasBasis = true;
        (*in_RDI->_simplifier->_vptr_SPxSimplifier[9])();
        VectorBase<double>::operator=
                  ((VectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),vec);
        (*in_RDI->_simplifier->_vptr_SPxSimplifier[10])();
        VectorBase<double>::operator=
                  ((VectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),vec);
        VectorBase<double>::~VectorBase((VectorBase<double> *)0x42ea5b);
        VectorBase<double>::~VectorBase((VectorBase<double> *)0x42ea68);
        VectorBase<double>::~VectorBase((VectorBase<double> *)0x42ea75);
        VectorBase<double>::~VectorBase((VectorBase<double> *)0x42ea82);
      }
      if (in_RDI->_statistics->iterations <= local_48) {
        iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                          (&in_RDI->_oldBasisStatusRows);
        iVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
        if (iVar3 == iVar9) {
          iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                            (&in_RDI->_oldBasisStatusCols);
          iVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
          if (iVar3 == iVar9) break;
        }
      }
      _storeBasisAsOldBasis
                (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                 (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffffaf0);
      break;
    case INFEASIBLE:
      if (in_RDI->_simplifier == (SPxSimplifier<double> *)0x0) {
        SPxSolverBase<double>::getDualfarkas
                  (in_stack_fffffffffffffb30,
                   (VectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        if (in_RDI->_scaler != (SPxScaler<double> *)0x0) {
          (*in_RDI->_scaler->_vptr_SPxScaler[0x24])(in_RDI->_scaler,&in_RDI->_solver,local_20);
        }
        SPxLPBase<double>::nRows((SPxLPBase<double> *)0x42f19f);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
        SPxLPBase<double>::nCols((SPxLPBase<double> *)0x42f1d6);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_28);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_30);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
        SPxSolverBase<double>::getBasis
                  ((SPxSolverBase<double> *)in_stack_fffffffffffffb00,
                   (VarStatus *)in_stack_fffffffffffffaf8,(VarStatus *)in_stack_fffffffffffffaf0,
                   (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(int)in_stack_fffffffffffffae8);
        in_RDI->_hasBasis = true;
        if (in_RDI->_statistics->iterations <= local_48) {
          iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                            (&in_RDI->_oldBasisStatusRows);
          iVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
          if (iVar3 == iVar9) {
            iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                              (&in_RDI->_oldBasisStatusCols);
            iVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
            if (iVar3 == iVar9) break;
          }
        }
        _storeBasisAsOldBasis
                  (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                   (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffffaf0)
        ;
      }
      else {
        in_RDI->_hasBasis = false;
        SLUFactorRational::clear
                  ((SLUFactorRational *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      }
      break;
    case ABORT_CYCLING:
      if ((in_RDI->_simplifier == (SPxSimplifier<double> *)0x0) &&
         (bVar2 = boolParam(in_RDI,ACCEPTCYCLING), bVar2)) {
        SPxSolverBase<double>::getPrimalSol
                  ((SPxSolverBase<double> *)
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   in_stack_fffffffffffffbc0);
        SPxSolverBase<double>::getDualSol
                  (in_stack_fffffffffffffb88,
                   (VectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        if (in_RDI->_scaler != (SPxScaler<double> *)0x0) {
          (*in_RDI->_scaler->_vptr_SPxScaler[0x22])(in_RDI->_scaler,&in_RDI->_solver,local_18);
          (*in_RDI->_scaler->_vptr_SPxScaler[0x24])(in_RDI->_scaler,&in_RDI->_solver,local_20);
        }
      }
      break;
    case ABORT_TIME:
    case ABORT_ITER:
    case ABORT_VALUE:
    case REGULAR:
    case RUNNING:
    case UNBOUNDED:
      this_00 = SPxSolverBase<double>::basis(&in_RDI->_solver);
      SVar8 = SPxBasisBase<double>::status(this_00);
      in_RDI->_hasBasis = NO_PROBLEM < SVar8;
      if (((in_RDI->_hasBasis & 1U) == 0) || (in_RDI->_simplifier != (SPxSimplifier<double> *)0x0))
      {
        in_RDI->_hasBasis = false;
        SLUFactorRational::clear
                  ((SLUFactorRational *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      }
      else {
        SPxLPBase<double>::nRows((SPxLPBase<double> *)0x42ef40);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
        SPxLPBase<double>::nCols((SPxLPBase<double> *)0x42ef83);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),iVar3);
        in_stack_fffffffffffffb58 = &in_RDI->_solver;
        in_stack_fffffffffffffb60 =
             (SPxSolverBase<double> *)
             DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_28);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_30);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
        SPxSolverBase<double>::getBasis
                  ((SPxSolverBase<double> *)in_stack_fffffffffffffb00,
                   (VarStatus *)in_stack_fffffffffffffaf8,(VarStatus *)in_stack_fffffffffffffaf0,
                   (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(int)in_stack_fffffffffffffae8);
        if (in_RDI->_statistics->iterations <= local_48) {
          in_stack_fffffffffffffb54 =
               DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                         (&in_RDI->_oldBasisStatusRows);
          iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_28);
          if (in_stack_fffffffffffffb54 == iVar3) {
            in_stack_fffffffffffffb50 =
                 DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                           (&in_RDI->_oldBasisStatusCols);
            iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_30);
            if (in_stack_fffffffffffffb50 == iVar3) break;
          }
        }
        _storeBasisAsOldBasis
                  (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                   (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffffaf0)
        ;
      }
      break;
    case SINGULAR:
    case INForUNBD:
    default:
      in_RDI->_hasBasis = false;
      SLUFactorRational::clear
                ((SLUFactorRational *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0))
      ;
    }
  }
  if ((in_RDI->_simplifier != (SPxSimplifier<double> *)0x0) ||
     (in_RDI->_scaler != (SPxScaler<double> *)0x0)) {
    SPxLPBase<double>::
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
              (&local_2d8,
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&in_RDI->_solver);
    SPxSolverBase<double>::loadLP
              (in_stack_fffffffffffffaf0,&in_stack_fffffffffffffae8->super_SPxLPBase<double>,
               SUB41((uint)in_stack_fffffffffffffae4 >> 0x18,0));
    SPxLPBase<double>::~SPxLPBase
              ((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
    (**(code **)*local_40)();
    spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                **)0x42f40b);
    if ((in_RDI->_hasBasis & 1U) != 0) {
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_28);
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(local_30);
      SPxSolverBase<double>::setBasis
                (in_stack_fffffffffffffb60,(VarStatus *)in_stack_fffffffffffffb58,
                 (VarStatus *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    }
  }
  return local_34;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealForRational(bool fromscratch,
      VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols)
{
   assert(_isConsistent());

   assert(_solver.nRows() == numRowsRational());
   assert(_solver.nCols() == numColsRational());
   assert(primal.dim() == numColsRational());
   assert(dual.dim() == numRowsRational());

   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

#ifndef SOPLEX_MANUAL_ALT

   if(fromscratch || !_hasBasis)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

#else
   _disableSimplifierAndScaler();
#endif

   // reset basis to slack basis when solving from scratch
   if(fromscratch)
      _solver.reLoad();

   // start timing
   _statistics->syncTime->start();

   // if preprocessing is applied, we need to restore the original LP at the end
   SPxLPRational* rationalLP = nullptr;

   if(_simplifier != nullptr || _scaler != nullptr)
   {
      spx_alloc(rationalLP);
      rationalLP = new(rationalLP) SPxLPRational(_solver);
   }

   // with preprocessing or solving from scratch, the basis may change, hence invalidate the
   // rational basis factorization
   if(_simplifier != nullptr || _scaler != nullptr || fromscratch)
      _rationalLUSolver.clear();

   // stop timing
   _statistics->syncTime->stop();

   try
   {
      // apply problem simplification
      typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

      int oldIterations = _statistics->iterations; // save previous number of iterations

      if(_simplifier != nullptr)
      {
         // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used
         bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;
         Real remainingTime = _solver.getMaxTime() - _solver.time();
         simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                                _solver.random.getSeed());
      }

      // apply scaling after the simplification
      if(_scaler != nullptr && simplificationStatus == SPxSimplifier<R>::OKAY)
         _scaler->scale(_solver, false);

      // run the simplex method if problem has not been solved by the simplifier
      if(simplificationStatus == SPxSimplifier<R>::OKAY)
      {
         SPX_MSG_INFO1(spxout, spxout << std::endl);

         _solveRealLPAndRecordStatistics();

         SPX_MSG_INFO1(spxout, spxout << std::endl);
      }

      ///@todo move to private helper methods
      // evaluate status flag
      if(simplificationStatus == SPxSimplifier<R>::INFEASIBLE)
         result = SPxSolverBase<R>::INFEASIBLE;
      else if(simplificationStatus == SPxSimplifier<R>::DUAL_INFEASIBLE)
         result = SPxSolverBase<R>::INForUNBD;
      else if(simplificationStatus == SPxSimplifier<R>::UNBOUNDED)
         result = SPxSolverBase<R>::UNBOUNDED;
      else if(simplificationStatus == SPxSimplifier<R>::VANISHED
              || simplificationStatus == SPxSimplifier<R>::OKAY)
      {
         result = simplificationStatus == SPxSimplifier<R>::VANISHED ? SPxSolverBase<R>::OPTIMAL :
                  _solver.status();

         ///@todo move to private helper methods
         // process result
         switch(result)
         {
         case SPxSolverBase<R>::OPTIMAL:

            // unsimplify if simplifier is active and LP is solved to optimality; this must be done here and not at solution
            // query, because we want to have the basis for the original problem
            if(_simplifier != nullptr)
            {
               assert(!_simplifier->isUnsimplified());
               assert(simplificationStatus == SPxSimplifier<R>::VANISHED
                      || simplificationStatus == SPxSimplifier<R>::OKAY);

               bool vanished = simplificationStatus == SPxSimplifier<R>::VANISHED;

               // get solution vectors for transformed problem
               VectorBase<R> tmpPrimal(vanished ? 0 : _solver.nCols());
               VectorBase<R> tmpSlacks(vanished ? 0 : _solver.nRows());
               VectorBase<R> tmpDual(vanished ? 0 : _solver.nRows());
               VectorBase<R> tmpRedCost(vanished ? 0 : _solver.nCols());

               if(!vanished)
               {
                  assert(_solver.status() == SPxSolverBase<R>::OPTIMAL);

                  _solver.getPrimalSol(tmpPrimal);
                  _solver.getSlacks(tmpSlacks);
                  _solver.getDualSol(tmpDual);
                  _solver.getRedCostSol(tmpRedCost);

                  // unscale vectors
                  if(_scaler != nullptr)
                  {
                     _scaler->unscalePrimal(_solver, tmpPrimal);
                     _scaler->unscaleSlacks(_solver, tmpSlacks);
                     _scaler->unscaleDual(_solver, tmpDual);
                     _scaler->unscaleRedCost(_solver, tmpRedCost);
                  }

                  // get basis of transformed problem
                  basisStatusRows.reSize(_solver.nRows());
                  basisStatusCols.reSize(_solver.nCols());
                  _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                   basisStatusCols.size());
               }

               try
               {
                  _simplifier->unsimplify(tmpPrimal, tmpDual, tmpSlacks, tmpRedCost, basisStatusRows.get_ptr(),
                                          basisStatusCols.get_ptr());
               }
               catch(const SPxInternalCodeException& E)
               {
                  // error message has already been printed
                  throw SPxInternalCodeException("Error storing the basis");
               }

               // store basis for original problem
               basisStatusRows.reSize(numRowsRational());
               basisStatusCols.reSize(numColsRational());
               _simplifier->getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                     basisStatusCols.size());
               _hasBasis = true;

               primal = _simplifier->unsimplifiedPrimal();
               dual = _simplifier->unsimplifiedDual();
            }
            else
            {
               _solver.getPrimalSol(primal);
               _solver.getDualSol(dual);

               // unscale vectors
               if(_scaler != nullptr)
               {
                  _scaler->unscalePrimal(_solver, primal);
                  _scaler->unscaleDual(_solver, dual);
               }

               // get basis of transformed problem
               basisStatusRows.reSize(_solver.nRows());
               basisStatusCols.reSize(_solver.nCols());
               _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                basisStatusCols.size());
               _hasBasis = true;
            }

            if(oldIterations < _statistics->iterations || _oldBasisStatusRows.size() != basisStatusRows.size()
                  || _oldBasisStatusCols.size() != basisStatusCols.size())
               _storeBasisAsOldBasis(basisStatusRows, basisStatusCols);

            break;

         case SPxSolverBase<R>::ABORT_CYCLING:
            if(_simplifier == nullptr && boolParam(SoPlexBase<R>::ACCEPTCYCLING))
            {
               _solver.getPrimalSol(primal);
               _solver.getDualSol(dual);

               // unscale vectors
               if(_scaler != nullptr)
               {
                  _scaler->unscalePrimal(_solver, primal);
                  _scaler->unscaleDual(_solver, dual);
               }
            }

            break;

         // intentional fallthrough
         case SPxSolverBase<R>::ABORT_TIME:
         case SPxSolverBase<R>::ABORT_ITER:
         case SPxSolverBase<R>::ABORT_VALUE:
         case SPxSolverBase<R>::REGULAR:
         case SPxSolverBase<R>::RUNNING:
         case SPxSolverBase<R>::UNBOUNDED:
            _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);

            if(_hasBasis && _simplifier == nullptr)
            {
               basisStatusRows.reSize(_solver.nRows());
               basisStatusCols.reSize(_solver.nCols());
               _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                basisStatusCols.size());

               if(oldIterations < _statistics->iterations || _oldBasisStatusRows.size() != basisStatusRows.size()
                     || _oldBasisStatusCols.size() != basisStatusCols.size())
                  _storeBasisAsOldBasis(basisStatusRows, basisStatusCols);
            }
            else
            {
               _hasBasis = false;
               _rationalLUSolver.clear();
            }

            break;

         case SPxSolverBase<R>::INFEASIBLE:

            // if simplifier is active we can currently not return a Farkas ray or basis
            if(_simplifier != nullptr)
            {
               _hasBasis = false;
               _rationalLUSolver.clear();
               break;
            }

            // return Farkas ray as dual solution
            _solver.getDualfarkas(dual);

            // unscale vectors
            if(_scaler != nullptr)
               _scaler->unscaleDual(_solver, dual);

            // get basis of transformed problem
            basisStatusRows.reSize(_solver.nRows());
            basisStatusCols.reSize(_solver.nCols());
            _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                             basisStatusCols.size());
            _hasBasis = true;


            if(oldIterations < _statistics->iterations || _oldBasisStatusRows.size() != basisStatusRows.size()
                  || _oldBasisStatusCols.size() != basisStatusCols.size())
               _storeBasisAsOldBasis(basisStatusRows, basisStatusCols);

            break;

         case SPxSolverBase<R>::INForUNBD:
         case SPxSolverBase<R>::SINGULAR:
         default:
            _hasBasis = false;
            _rationalLUSolver.clear();
            break;
         }
      }
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Exception thrown during floating-point solve.\n");
      result = SPxSolverBase<R>::ERROR;
      _hasBasis = false;
      _rationalLUSolver.clear();

   }

   // restore original LP if necessary
   if(_simplifier != nullptr || _scaler != nullptr)
   {
      assert(rationalLP != nullptr);
      _solver.loadLP((SPxLPBase<R>)(*rationalLP));
      rationalLP->~SPxLPRational();
      spx_free(rationalLP);

      if(_hasBasis)
         _solver.setBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr());
   }

   return result;
}